

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.cpp
# Opt level: O3

int32_t __thiscall
icu_63::UnicodeString::extract
          (UnicodeString *this,int32_t start,int32_t length,char *target,int32_t targetCapacity,
          EInvariant param_5)

{
  short sVar1;
  int32_t iVar2;
  int iVar3;
  int iVar4;
  int length_00;
  char16_t *pcVar5;
  UErrorCode status;
  UErrorCode local_1c;
  
  iVar2 = 0;
  if ((-1 < targetCapacity) && (target != (char *)0x0 || targetCapacity == 0)) {
    sVar1 = (this->fUnion).fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      iVar4 = (this->fUnion).fFields.fLength;
    }
    else {
      iVar4 = (int)sVar1 >> 5;
    }
    iVar3 = start;
    if (iVar4 < start) {
      iVar3 = iVar4;
    }
    if (start < 0) {
      iVar3 = 0;
    }
    length_00 = iVar4 - iVar3;
    if (length <= iVar4 - iVar3) {
      length_00 = length;
    }
    if (length < 0) {
      length_00 = 0;
    }
    if (length_00 <= targetCapacity) {
      if (((int)sVar1 & 2U) == 0) {
        pcVar5 = (this->fUnion).fFields.fArray;
      }
      else {
        pcVar5 = (char16_t *)((long)&this->fUnion + 2);
      }
      u_UCharsToChars_63(pcVar5 + iVar3,target,length_00);
    }
    local_1c = U_ZERO_ERROR;
    iVar2 = u_terminateChars_63(target,targetCapacity,length_00,&local_1c);
  }
  return iVar2;
}

Assistant:

int32_t
UnicodeString::extract(int32_t start,
                       int32_t length,
                       char *target,
                       int32_t targetCapacity,
                       enum EInvariant) const
{
  // if the arguments are illegal, then do nothing
  if(targetCapacity < 0 || (targetCapacity > 0 && target == NULL)) {
    return 0;
  }

  // pin the indices to legal values
  pinIndices(start, length);

  if(length <= targetCapacity) {
    u_UCharsToChars(getArrayStart() + start, target, length);
  }
  UErrorCode status = U_ZERO_ERROR;
  return u_terminateChars(target, targetCapacity, length, &status);
}